

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeDelete(BtCursor *pCur,u8 flags)

{
  char cVar1;
  u32 uVar2;
  MemPage *pPage_00;
  MemPage *pPage_01;
  u8 *pTemp;
  u16 uVar3;
  int iVar4;
  u8 *puVar5;
  int iVar6;
  uchar *pTmp;
  Pgno n;
  int nCell;
  MemPage *pLeaf;
  undefined1 local_68 [7];
  u8 bPreserve;
  CellInfo info;
  int iCellDepth;
  int iCellIdx;
  uchar *pCell;
  MemPage *pPage;
  sqlite3 *psStack_30;
  int rc;
  BtShared *pBt;
  Btree *p;
  BtCursor *pBStack_18;
  u8 flags_local;
  BtCursor *pCur_local;
  
  pBt = (BtShared *)pCur->pBtree;
  psStack_30 = pBt->db;
  p._7_1_ = flags;
  pBStack_18 = pCur;
  if (pCur->eState != '\0') {
    if (pCur->eState < 3) {
      iVar4 = sqlite3CorruptError(0x12ecb);
      return iVar4;
    }
    iVar4 = btreeRestoreCursorPosition(pCur);
    if (iVar4 != 0) {
      return iVar4;
    }
    if (pBStack_18->eState != '\0') {
      return 0;
    }
    pPage._4_4_ = 0;
  }
  info.nPayload = (u32)pBStack_18->iPage;
  info._20_4_ = ZEXT24(pBStack_18->ix);
  pPage_00 = pBStack_18->pPage;
  if ((uint)info._20_4_ < (uint)pPage_00->nCell) {
    puVar5 = pPage_00->aData +
             (int)(uint)(pPage_00->maskPage &
                        CONCAT11(pPage_00->aCellIdx[(int)(info._20_4_ << 1)],
                                 pPage_00->aCellIdx[(long)(int)(info._20_4_ << 1) + 1]));
    if ((pPage_00->nFree < 0) && (iVar4 = btreeComputeFreeSpace(pPage_00), iVar4 != 0)) {
      pCur_local._4_4_ = sqlite3CorruptError(0x12ed8);
    }
    else {
      pLeaf._7_1_ = (p._7_1_ & 2) != 0;
      if ((bool)pLeaf._7_1_) {
        if (((pPage_00->leaf == '\0') ||
            (iVar4 = pPage_00->nFree, uVar3 = (*pPage_00->xCellSize)(pPage_00,puVar5),
            (int)((*(u32 *)&psStack_30->lastRowid << 1) / 3) < (int)(iVar4 + (uint)uVar3 + 2))) ||
           (pPage_00->nCell == 1)) {
          iVar4 = saveCursorKey(pBStack_18);
          if (iVar4 != 0) {
            return iVar4;
          }
          pPage._4_4_ = 0;
        }
        else {
          pLeaf._7_1_ = 2;
        }
      }
      if (pPage_00->leaf == '\0') {
        iVar4 = sqlite3BtreePrevious(pBStack_18,0);
        if (iVar4 != 0) {
          return iVar4;
        }
        pPage._4_4_ = 0;
      }
      if ((pBStack_18->curFlags & 0x20) != 0) {
        iVar4 = saveAllCursors((BtShared *)psStack_30,pBStack_18->pgnoRoot,pBStack_18);
        if (iVar4 != 0) {
          return iVar4;
        }
        pPage._4_4_ = 0;
      }
      if ((pBStack_18->pKeyInfo == (KeyInfo *)0x0) && (*(char *)((long)&pBt->pCursor + 3) != '\0'))
      {
        invalidateIncrblobCursors((Btree *)pBt,pBStack_18->pgnoRoot,(pBStack_18->info).nKey,0);
      }
      pPage._4_4_ = sqlite3PagerWrite(pPage_00->pDbPage);
      pCur_local._4_4_ = pPage._4_4_;
      if (pPage._4_4_ == 0) {
        (*pPage_00->xParseCell)(pPage_00,puVar5,(CellInfo *)local_68);
        if (info.pPayload._4_2_ == (uint)info.pPayload) {
          pPage._4_4_ = 0;
        }
        else {
          pPage._4_4_ = clearCellOverflow(pPage_00,puVar5,(CellInfo *)local_68);
        }
        dropCell(pPage_00,info._20_4_,(uint)info.pPayload._6_2_,(int *)((long)&pPage + 4));
        if (pPage._4_4_ == 0) {
          if (pPage_00->leaf == '\0') {
            pPage_01 = pBStack_18->pPage;
            if (pPage_01->nFree < 0) {
              iVar4 = btreeComputeFreeSpace(pPage_01);
              if (iVar4 != 0) {
                return iVar4;
              }
              pPage._4_4_ = 0;
            }
            if ((int)info.nPayload < pBStack_18->iPage + -1) {
              pTmp._0_4_ = pBStack_18->apPage[(int)(info.nPayload + 1)]->pgno;
            }
            else {
              pTmp._0_4_ = pBStack_18->pPage->pgno;
            }
            puVar5 = pPage_01->aData +
                     (int)(uint)(pPage_01->maskPage &
                                CONCAT11(pPage_01->aCellIdx[(int)((pPage_01->nCell - 1) * 2)],
                                         pPage_01->aCellIdx
                                         [(long)(int)((pPage_01->nCell - 1) * 2) + 1]));
            if (puVar5 < pPage_01->aData + 4) {
              iVar4 = sqlite3CorruptError(0x12f33);
              return iVar4;
            }
            uVar3 = (*pPage_01->xCellSize)(pPage_01,puVar5);
            pTemp = *(u8 **)psStack_30->aLimit;
            pPage._4_4_ = sqlite3PagerWrite(pPage_01->pDbPage);
            if (pPage._4_4_ == 0) {
              insertCell(pPage_00,info._20_4_,puVar5 + -4,uVar3 + 4,pTemp,(Pgno)pTmp,
                         (int *)((long)&pPage + 4));
            }
            dropCell(pPage_01,pPage_01->nCell - 1,(uint)uVar3,(int *)((long)&pPage + 4));
            if (pPage._4_4_ != 0) {
              return pPage._4_4_;
            }
          }
          iVar4 = pBStack_18->pPage->nFree * 3;
          uVar2 = pBStack_18->pBt->usableSize;
          iVar6 = uVar2 * 2;
          if (iVar4 == iVar6 || SBORROW4(iVar4,iVar6) != (int)(iVar4 + uVar2 * -2) < 0) {
            pPage._4_4_ = 0;
          }
          else {
            pPage._4_4_ = balance(pBStack_18);
          }
          if ((pPage._4_4_ == 0) && ((int)info.nPayload < (int)pBStack_18->iPage)) {
            releasePageNotNull(pBStack_18->pPage);
            pBStack_18->iPage = pBStack_18->iPage + -1;
            while ((int)info.nPayload < (int)pBStack_18->iPage) {
              cVar1 = pBStack_18->iPage;
              pBStack_18->iPage = cVar1 + -1;
              releasePage(pBStack_18->apPage[cVar1]);
            }
            pBStack_18->pPage = pBStack_18->apPage[pBStack_18->iPage];
            pPage._4_4_ = balance(pBStack_18);
          }
          if (pPage._4_4_ == 0) {
            if (pLeaf._7_1_ < 2) {
              pPage._4_4_ = moveToRoot(pBStack_18);
              if (pLeaf._7_1_ != 0) {
                btreeReleaseAllCursorPages(pBStack_18);
                pBStack_18->eState = '\x03';
              }
              if (pPage._4_4_ == 0x10) {
                pPage._4_4_ = 0;
              }
            }
            else {
              pBStack_18->eState = '\x02';
              if ((int)info._20_4_ < (int)(uint)pPage_00->nCell) {
                pBStack_18->skipNext = 1;
              }
              else {
                pBStack_18->skipNext = -1;
                pBStack_18->ix = pPage_00->nCell - 1;
              }
            }
          }
          pCur_local._4_4_ = pPage._4_4_;
        }
        else {
          pCur_local._4_4_ = pPage._4_4_;
        }
      }
    }
  }
  else {
    pCur_local._4_4_ = sqlite3CorruptError(0x12ed4);
  }
  return pCur_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDelete(BtCursor *pCur, u8 flags){
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  int rc;                    /* Return code */
  MemPage *pPage;            /* Page to delete cell from */
  unsigned char *pCell;      /* Pointer to cell to delete */
  int iCellIdx;              /* Index of cell to delete */
  int iCellDepth;            /* Depth of node containing pCell */
  CellInfo info;             /* Size of the cell being deleted */
  u8 bPreserve;              /* Keep cursor valid.  2 for CURSOR_SKIPNEXT */

  assert( cursorOwnsBtShared(pCur) );
  assert( pBt->inTransaction==TRANS_WRITE );
  assert( (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( pCur->curFlags & BTCF_WriteFlag );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );
  assert( !hasReadConflicts(p, pCur->pgnoRoot) );
  assert( (flags & ~(BTREE_SAVEPOSITION | BTREE_AUXDELETE))==0 );
  if( pCur->eState!=CURSOR_VALID ){
    if( pCur->eState>=CURSOR_REQUIRESEEK ){
      rc = btreeRestoreCursorPosition(pCur);
      assert( rc!=SQLITE_OK || CORRUPT_DB || pCur->eState==CURSOR_VALID );
      if( rc || pCur->eState!=CURSOR_VALID ) return rc;
    }else{
      return SQLITE_CORRUPT_BKPT;
    }
  }
  assert( pCur->eState==CURSOR_VALID );

  iCellDepth = pCur->iPage;
  iCellIdx = pCur->ix;
  pPage = pCur->pPage;
  if( pPage->nCell<=iCellIdx ){
    return SQLITE_CORRUPT_BKPT;
  }
  pCell = findCell(pPage, iCellIdx);
  if( pPage->nFree<0 && btreeComputeFreeSpace(pPage) ){
    return SQLITE_CORRUPT_BKPT;
  }

  /* If the BTREE_SAVEPOSITION bit is on, then the cursor position must
  ** be preserved following this delete operation. If the current delete
  ** will cause a b-tree rebalance, then this is done by saving the cursor
  ** key and leaving the cursor in CURSOR_REQUIRESEEK state before
  ** returning.
  **
  ** If the current delete will not cause a rebalance, then the cursor
  ** will be left in CURSOR_SKIPNEXT state pointing to the entry immediately
  ** before or after the deleted entry.
  **
  ** The bPreserve value records which path is required:
  **
  **    bPreserve==0         Not necessary to save the cursor position
  **    bPreserve==1         Use CURSOR_REQUIRESEEK to save the cursor position
  **    bPreserve==2         Cursor won't move.  Set CURSOR_SKIPNEXT.
  */
  bPreserve = (flags & BTREE_SAVEPOSITION)!=0;
  if( bPreserve ){
    if( !pPage->leaf
     || (pPage->nFree+pPage->xCellSize(pPage,pCell)+2) >
                                                   (int)(pBt->usableSize*2/3)
     || pPage->nCell==1  /* See dbfuzz001.test for a test case */
    ){
      /* A b-tree rebalance will be required after deleting this entry.
      ** Save the cursor key.  */
      rc = saveCursorKey(pCur);
      if( rc ) return rc;
    }else{
      bPreserve = 2;
    }
  }

  /* If the page containing the entry to delete is not a leaf page, move
  ** the cursor to the largest entry in the tree that is smaller than
  ** the entry being deleted. This cell will replace the cell being deleted
  ** from the internal node. The 'previous' entry is used for this instead
  ** of the 'next' entry, as the previous entry is always a part of the
  ** sub-tree headed by the child page of the cell being deleted. This makes
  ** balancing the tree following the delete operation easier.  */
  if( !pPage->leaf ){
    rc = sqlite3BtreePrevious(pCur, 0);
    assert( rc!=SQLITE_DONE );
    if( rc ) return rc;
  }

  /* Save the positions of any other cursors open on this table before
  ** making any modifications.  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  /* If this is a delete operation to remove a row from a table b-tree,
  ** invalidate any incrblob cursors open on the row being deleted.  */
  if( pCur->pKeyInfo==0 && p->hasIncrblobCur ){
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pCur->info.nKey, 0);
  }

  /* Make the page containing the entry to be deleted writable. Then free any
  ** overflow pages associated with the entry and finally remove the cell
  ** itself from within the page.  */
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc ) return rc;
  BTREE_CLEAR_CELL(rc, pPage, pCell, info);
  dropCell(pPage, iCellIdx, info.nSize, &rc);
  if( rc ) return rc;

  /* If the cell deleted was not located on a leaf page, then the cursor
  ** is currently pointing to the largest entry in the sub-tree headed
  ** by the child-page of the cell that was just deleted from an internal
  ** node. The cell from the leaf node needs to be moved to the internal
  ** node to replace the deleted cell.  */
  if( !pPage->leaf ){
    MemPage *pLeaf = pCur->pPage;
    int nCell;
    Pgno n;
    unsigned char *pTmp;

    if( pLeaf->nFree<0 ){
      rc = btreeComputeFreeSpace(pLeaf);
      if( rc ) return rc;
    }
    if( iCellDepth<pCur->iPage-1 ){
      n = pCur->apPage[iCellDepth+1]->pgno;
    }else{
      n = pCur->pPage->pgno;
    }
    pCell = findCell(pLeaf, pLeaf->nCell-1);
    if( pCell<&pLeaf->aData[4] ) return SQLITE_CORRUPT_BKPT;
    nCell = pLeaf->xCellSize(pLeaf, pCell);
    assert( MX_CELL_SIZE(pBt) >= nCell );
    pTmp = pBt->pTmpSpace;
    assert( pTmp!=0 );
    rc = sqlite3PagerWrite(pLeaf->pDbPage);
    if( rc==SQLITE_OK ){
      insertCell(pPage, iCellIdx, pCell-4, nCell+4, pTmp, n, &rc);
    }
    dropCell(pLeaf, pLeaf->nCell-1, nCell, &rc);
    if( rc ) return rc;
  }

  /* Balance the tree. If the entry deleted was located on a leaf page,
  ** then the cursor still points to that page. In this case the first
  ** call to balance() repairs the tree, and the if(...) condition is
  ** never true.
  **
  ** Otherwise, if the entry deleted was on an internal node page, then
  ** pCur is pointing to the leaf page from which a cell was removed to
  ** replace the cell deleted from the internal node. This is slightly
  ** tricky as the leaf node may be underfull, and the internal node may
  ** be either under or overfull. In this case run the balancing algorithm
  ** on the leaf node first. If the balance proceeds far enough up the
  ** tree that we can be sure that any problem in the internal node has
  ** been corrected, so be it. Otherwise, after balancing the leaf node,
  ** walk the cursor up the tree to the internal node and balance it as
  ** well.  */
  assert( pCur->pPage->nOverflow==0 );
  assert( pCur->pPage->nFree>=0 );
  if( pCur->pPage->nFree*3<=(int)pCur->pBt->usableSize*2 ){
    /* Optimization: If the free space is less than 2/3rds of the page,
    ** then balance() will always be a no-op.  No need to invoke it. */
    rc = SQLITE_OK;
  }else{
    rc = balance(pCur);
  }
  if( rc==SQLITE_OK && pCur->iPage>iCellDepth ){
    releasePageNotNull(pCur->pPage);
    pCur->iPage--;
    while( pCur->iPage>iCellDepth ){
      releasePage(pCur->apPage[pCur->iPage--]);
    }
    pCur->pPage = pCur->apPage[pCur->iPage];
    rc = balance(pCur);
  }

  if( rc==SQLITE_OK ){
    if( bPreserve>1 ){
      assert( (pCur->iPage==iCellDepth || CORRUPT_DB) );
      assert( pPage==pCur->pPage || CORRUPT_DB );
      assert( (pPage->nCell>0 || CORRUPT_DB) && iCellIdx<=pPage->nCell );
      pCur->eState = CURSOR_SKIPNEXT;
      if( iCellIdx>=pPage->nCell ){
        pCur->skipNext = -1;
        pCur->ix = pPage->nCell-1;
      }else{
        pCur->skipNext = 1;
      }
    }else{
      rc = moveToRoot(pCur);
      if( bPreserve ){
        btreeReleaseAllCursorPages(pCur);
        pCur->eState = CURSOR_REQUIRESEEK;
      }
      if( rc==SQLITE_EMPTY ) rc = SQLITE_OK;
    }
  }
  return rc;
}